

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qaccessiblewidgetfactory.cpp
# Opt level: O2

QAccessibleInterface * qAccessibleFactory(QString *classname,QObject *object)

{
  bool bVar1;
  QAccessibleAbstractSpinBox *this;
  QAccessibleTable *this_00;
  Role RVar2;
  long in_FS_OFFSET;
  QLatin1StringView local_78;
  QLatin1StringView local_68;
  QLatin1StringView local_58;
  QArrayDataPointer<char16_t> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if (((object == (QObject *)0x0) || ((*(byte *)(*(long *)(object + 8) + 0x30) & 1) == 0)) ||
     ((*(byte *)(*(long *)(object + 8) + 0x1c2) & 4) != 0)) {
LAB_004d06b4:
    this = (QAccessibleAbstractSpinBox *)0x0;
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0x9;
  local_48.ptr = L"QLineEdit";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    QObject::objectName();
    local_58.m_size = 0x13;
    local_58.m_data = "qt_spinbox_lineedit";
    bVar1 = operator==((QString *)&local_48,&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    if (bVar1) goto LAB_004d06b4;
    this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
    local_48.d = (Data *)0x0;
    local_48.ptr = (char16_t *)0x0;
    local_48.size = 0;
    QAccessibleLineEdit::QAccessibleLineEdit
              ((QAccessibleLineEdit *)this,(QWidget *)object,(QString *)&local_48);
LAB_004d073e:
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0x9;
  local_48.ptr = L"QComboBox";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
    QAccessibleComboBox::QAccessibleComboBox((QAccessibleComboBox *)this,(QWidget *)object);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0x10;
  local_48.ptr = L"QAbstractSpinBox";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
    QAccessibleAbstractSpinBox::QAccessibleAbstractSpinBox(this,(QWidget *)object);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0x8;
  local_48.ptr = L"QSpinBox";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
    QAccessibleSpinBox::QAccessibleSpinBox((QAccessibleSpinBox *)this,(QWidget *)object);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0xe;
  local_48.ptr = L"QDoubleSpinBox";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x40);
    QAccessibleDoubleSpinBox::QAccessibleDoubleSpinBox
              ((QAccessibleDoubleSpinBox *)this,(QWidget *)object);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0xa;
  local_48.ptr = L"QScrollBar";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
    QAccessibleScrollBar::QAccessibleScrollBar((QAccessibleScrollBar *)this,(QWidget *)object);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0xf;
  local_48.ptr = L"QAbstractSlider";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
    QAccessibleAbstractSlider::QAccessibleAbstractSlider
              ((QAccessibleAbstractSlider *)this,(QWidget *)object,Slider);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0x7;
  local_48.ptr = L"QSlider";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
    QAccessibleSlider::QAccessibleSlider((QAccessibleSlider *)this,(QWidget *)object);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0xb;
  local_48.ptr = L"QToolButton";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (bVar1) {
    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
    QAccessibleToolButton::QAccessibleToolButton((QAccessibleToolButton *)this,(QWidget *)object);
    goto LAB_004d06b7;
  }
  local_48.d = (Data *)0x9;
  local_48.ptr = L"QCheckBox";
  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
  if (!bVar1) {
    local_58.m_size = 0xc;
    local_58.m_data = "QRadioButton";
    bVar1 = operator==(classname,&local_58);
    if (!bVar1) {
      local_68.m_size = 0xb;
      local_68.m_data = "QPushButton";
      bVar1 = operator==(classname,&local_68);
      if (!bVar1) {
        local_78.m_size = 0xf;
        local_78.m_data = "QAbstractButton";
        bVar1 = operator==(classname,&local_78);
        if (!bVar1) {
          local_48.d = (Data *)0x7;
          local_48.ptr = L"QDialog";
          bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
          if (bVar1) {
            this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
            RVar2 = Dialog;
            goto LAB_004d09e6;
          }
          local_48.d = (Data *)0xb;
          local_48.ptr = L"QMessageBox";
          bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
          if (bVar1) {
            this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
            QAccessibleMessageBox::QAccessibleMessageBox
                      ((QAccessibleMessageBox *)this,(QWidget *)object);
            goto LAB_004d06b7;
          }
          local_48.d = (Data *)0xb;
          local_48.ptr = L"QMainWindow";
          bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
          if (bVar1) {
            this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
            QAccessibleMainWindow::QAccessibleMainWindow
                      ((QAccessibleMainWindow *)this,(QWidget *)object);
            goto LAB_004d06b7;
          }
          local_48.d = (Data *)0x6;
          local_48.ptr = L"QLabel";
          bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
          if (bVar1) {
LAB_004d0abc:
            this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
            RVar2 = StaticText;
          }
          else {
            local_58.m_size = 10;
            local_58.m_data = "QLCDNumber";
            bVar1 = operator==(classname,&local_58);
            if (bVar1) goto LAB_004d0abc;
            local_48.d = (Data *)0x9;
            local_48.ptr = L"QGroupBox";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
              QAccessibleGroupBox::QAccessibleGroupBox
                        ((QAccessibleGroupBox *)this,(QWidget *)object);
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0xa;
            local_48.ptr = L"QStatusBar";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) goto LAB_004d0abc;
            local_48.d = (Data *)0xc;
            local_48.ptr = L"QProgressBar";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
              QAccessibleProgressBar::QAccessibleProgressBar
                        ((QAccessibleProgressBar *)this,(QWidget *)object);
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0x8;
            local_48.ptr = L"QToolBar";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
              QWidget::windowTitle((QString *)&local_48,(QWidget *)object);
              RVar2 = ToolBar;
LAB_004d09ea:
              QAccessibleWidget::QAccessibleWidget
                        (&this->super_QAccessibleWidget,(QWidget *)object,RVar2,(QString *)&local_48
                        );
              goto LAB_004d073e;
            }
            local_48.d = (Data *)0x8;
            local_48.ptr = L"QMenuBar";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
              QAccessibleMenuBar::QAccessibleMenuBar((QAccessibleMenuBar *)this,(QWidget *)object);
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0x5;
            local_48.ptr = L"QMenu";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
              QAccessibleMenu::QAccessibleMenu((QAccessibleMenu *)this,(QWidget *)object);
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0x9;
            local_48.ptr = L"QTreeView";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this_00 = (QAccessibleTable *)operator_new(0x30);
              QAccessibleTree::QAccessibleTree((QAccessibleTree *)this_00,(QWidget *)object);
LAB_004d0cf6:
              this = (QAccessibleAbstractSpinBox *)&this_00->super_QAccessibleObject;
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0x9;
            local_48.ptr = L"QListView";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this_00 = (QAccessibleTable *)operator_new(0x30);
              QAccessibleList::QAccessibleList((QAccessibleList *)this_00,(QWidget *)object);
              goto LAB_004d0cf6;
            }
            local_48.d = (Data *)0xa;
            local_48.ptr = L"QTableView";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this_00 = (QAccessibleTable *)operator_new(0x30);
              QAccessibleTable::QAccessibleTable(this_00,(QWidget *)object);
              goto LAB_004d0cf6;
            }
            local_48.d = (Data *)0x7;
            local_48.ptr = L"QTabBar";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
              QAccessibleTabBar::QAccessibleTabBar((QAccessibleTabBar *)this,(QWidget *)object);
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0x9;
            local_48.ptr = L"QSizeGrip";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
LAB_004d0d60:
              this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
              RVar2 = Grip;
LAB_004d09e6:
              local_48.size = 0;
              local_48.ptr = (char16_t *)0x0;
              local_48.d = (Data *)0x0;
              goto LAB_004d09ea;
            }
            local_48.d = (Data *)0x9;
            local_48.ptr = L"QSplitter";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
              RVar2 = Splitter;
              goto LAB_004d09e6;
            }
            local_48.d = (Data *)0xf;
            local_48.ptr = L"QSplitterHandle";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) goto LAB_004d0d60;
            local_48.d = (Data *)0x9;
            local_48.ptr = L"QTextEdit";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
              QAccessibleTextEdit::QAccessibleTextEdit
                        ((QAccessibleTextEdit *)this,(QWidget *)object);
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0xe;
            local_48.ptr = L"QPlainTextEdit";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (bVar1) {
              this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
              QAccessiblePlainTextEdit::QAccessiblePlainTextEdit
                        ((QAccessiblePlainTextEdit *)this,(QWidget *)object);
              goto LAB_004d06b7;
            }
            local_48.d = (Data *)0x9;
            local_48.ptr = L"QTipLabel";
            bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
            if (!bVar1) {
              local_48.d = (Data *)0x6;
              local_48.ptr = L"QFrame";
              bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
              if (!bVar1) {
                local_48.d = (Data *)0xe;
                local_48.ptr = L"QStackedWidget";
                bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                if (bVar1) {
                  this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                  QAccessibleStackedWidget::QAccessibleStackedWidget
                            ((QAccessibleStackedWidget *)this,(QWidget *)object);
                  goto LAB_004d06b7;
                }
                local_48.d = (Data *)0x8;
                local_48.ptr = L"QToolBox";
                bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                if (bVar1) {
                  this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                  QAccessibleToolBox::QAccessibleToolBox
                            ((QAccessibleToolBox *)this,(QWidget *)object);
                  goto LAB_004d06b7;
                }
                local_48.d = (Data *)0x8;
                local_48.ptr = L"QMdiArea";
                bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                if (bVar1) {
                  this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                  QAccessibleMdiArea::QAccessibleMdiArea
                            ((QAccessibleMdiArea *)this,(QWidget *)object);
                  goto LAB_004d06b7;
                }
                local_48.d = (Data *)0xd;
                local_48.ptr = L"QMdiSubWindow";
                bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                if (bVar1) {
                  this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                  QAccessibleMdiSubWindow::QAccessibleMdiSubWindow
                            ((QAccessibleMdiSubWindow *)this,(QWidget *)object);
                  goto LAB_004d06b7;
                }
                local_48.d = (Data *)0x10;
                local_48.ptr = L"QDialogButtonBox";
                bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                if (bVar1) {
                  this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                  QAccessibleDialogButtonBox::QAccessibleDialogButtonBox
                            ((QAccessibleDialogButtonBox *)this,(QWidget *)object);
                  goto LAB_004d06b7;
                }
                local_48.d = (Data *)0x5;
                local_48.ptr = L"QDial";
                bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                if (bVar1) {
                  this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
                  QAccessibleDial::QAccessibleDial((QAccessibleDial *)this,(QWidget *)object);
                  goto LAB_004d06b7;
                }
                local_48.d = (Data *)0xb;
                local_48.ptr = L"QRubberBand";
                bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                if (!bVar1) {
                  local_48.d = (Data *)0xc;
                  local_48.ptr = L"QTextBrowser";
                  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                  if (bVar1) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x30);
                    QAccessibleTextBrowser::QAccessibleTextBrowser
                              ((QAccessibleTextBrowser *)this,(QWidget *)object);
                    goto LAB_004d06b7;
                  }
                  local_48.d = (Data *)0x13;
                  local_48.ptr = L"QAbstractScrollArea";
                  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                  if (bVar1) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    QAccessibleAbstractScrollArea::QAccessibleAbstractScrollArea
                              ((QAccessibleAbstractScrollArea *)this,(QWidget *)object);
                    goto LAB_004d06b7;
                  }
                  local_48.d = (Data *)0xb;
                  local_48.ptr = L"QScrollArea";
                  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                  if (bVar1) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    QAccessibleScrollArea::QAccessibleScrollArea
                              ((QAccessibleScrollArea *)this,(QWidget *)object);
                    goto LAB_004d06b7;
                  }
                  local_48.d = (Data *)0xf;
                  local_48.ptr = L"QCalendarWidget";
                  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                  if (bVar1) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    QAccessibleCalendarWidget::QAccessibleCalendarWidget
                              ((QAccessibleCalendarWidget *)this,(QWidget *)object);
                    goto LAB_004d06b7;
                  }
                  local_48.d = (Data *)0xb;
                  local_48.ptr = L"QDockWidget";
                  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                  if (bVar1) {
                    this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                    QAccessibleDockWidget::QAccessibleDockWidget
                              ((QAccessibleDockWidget *)this,(QWidget *)object);
                    goto LAB_004d06b7;
                  }
                  local_48.d = (Data *)0x7;
                  local_48.ptr = L"QWidget";
                  bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                  if (!bVar1) {
                    local_48.d = (Data *)0x10;
                    local_48.ptr = L"QWindowContainer";
                    bVar1 = operator==(classname,(QLatin1StringView *)&local_48);
                    if (bVar1) {
                      this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                      QAccessibleWindowContainer::QAccessibleWindowContainer
                                ((QAccessibleWindowContainer *)this,(QWidget *)object);
                      goto LAB_004d06b7;
                    }
                    goto LAB_004d06b4;
                  }
                  this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
                  RVar2 = Client;
                  goto LAB_004d09e6;
                }
              }
              this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
              RVar2 = Border;
              goto LAB_004d09e6;
            }
            this = (QAccessibleAbstractSpinBox *)operator_new(0x28);
            RVar2 = ToolTip;
          }
          QAccessibleDisplay::QAccessibleDisplay((QAccessibleDisplay *)this,(QWidget *)object,RVar2)
          ;
          goto LAB_004d06b7;
        }
      }
    }
  }
  this = (QAccessibleAbstractSpinBox *)operator_new(0x20);
  QAccessibleButton::QAccessibleButton((QAccessibleButton *)this,(QWidget *)object);
LAB_004d06b7:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return (QAccessibleInterface *)this;
  }
  __stack_chk_fail();
}

Assistant:

QAccessibleInterface *qAccessibleFactory(const QString &classname, QObject *object)
{
    QAccessibleInterface *iface = nullptr;
    if (!object || !object->isWidgetType())
        return iface;

    QWidget *widget = static_cast<QWidget*>(object);
    // QWidget emits destroyed() from its destructor instead of letting the QObject
    // destructor do it, which means the QWidget is unregistered from the accessibillity
    // cache. But QWidget destruction also emits enter and leave events, which may end
    // up here, so we have to ensure that we don't fill the cache with an entry of
    // a widget that is going away.
    if (QWidgetPrivate::get(widget)->data.in_destructor)
        return iface;

    if (false) {
#if QT_CONFIG(lineedit)
    } else if (classname == "QLineEdit"_L1) {
        if (widget->objectName() == "qt_spinbox_lineedit"_L1)
            iface = nullptr;
        else
            iface = new QAccessibleLineEdit(widget);
#endif
#if QT_CONFIG(combobox)
    } else if (classname == "QComboBox"_L1) {
        iface = new QAccessibleComboBox(widget);
#endif
#if QT_CONFIG(spinbox)
    } else if (classname == "QAbstractSpinBox"_L1) {
        iface = new QAccessibleAbstractSpinBox(widget);
    } else if (classname == "QSpinBox"_L1) {
        iface = new QAccessibleSpinBox(widget);
    } else if (classname == "QDoubleSpinBox"_L1) {
        iface = new QAccessibleDoubleSpinBox(widget);
#endif
#if QT_CONFIG(scrollbar)
    } else if (classname == "QScrollBar"_L1) {
        iface = new QAccessibleScrollBar(widget);
#endif
#if QT_CONFIG(slider)
    } else if (classname == "QAbstractSlider"_L1) {
        iface = new QAccessibleAbstractSlider(widget);
    } else if (classname == "QSlider"_L1) {
        iface = new QAccessibleSlider(widget);
#endif
#if QT_CONFIG(toolbutton)
    } else if (classname == "QToolButton"_L1) {
        iface = new QAccessibleToolButton(widget);
#endif // QT_CONFIG(toolbutton)
#if QT_CONFIG(abstractbutton)
    } else if (classname == "QCheckBox"_L1
            || classname == "QRadioButton"_L1
            || classname == "QPushButton"_L1
            || classname == "QAbstractButton"_L1) {
        iface = new QAccessibleButton(widget);
#endif
    } else if (classname == "QDialog"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Dialog);
#if QT_CONFIG(messagebox)
    } else if (classname == "QMessageBox"_L1) {
        iface = new QAccessibleMessageBox(widget);
#endif
#if QT_CONFIG(mainwindow)
    } else if (classname == "QMainWindow"_L1) {
        iface = new QAccessibleMainWindow(widget);
#endif
    } else if (classname == "QLabel"_L1 || classname == "QLCDNumber"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(groupbox)
    } else if (classname == "QGroupBox"_L1) {
        iface = new QAccessibleGroupBox(widget);
#endif
    } else if (classname == "QStatusBar"_L1) {
        iface = new QAccessibleDisplay(widget);
#if QT_CONFIG(progressbar)
    } else if (classname == "QProgressBar"_L1) {
        iface = new QAccessibleProgressBar(widget);
#endif
    } else if (classname == "QToolBar"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::ToolBar, widget->windowTitle());
#if QT_CONFIG(menubar)
    } else if (classname == "QMenuBar"_L1) {
        iface = new QAccessibleMenuBar(widget);
#endif
#if QT_CONFIG(menu)
    } else if (classname == "QMenu"_L1) {
        iface = new QAccessibleMenu(widget);
#endif
#if QT_CONFIG(treeview)
    } else if (classname == "QTreeView"_L1) {
        iface = new QAccessibleTree(widget);
#endif // QT_CONFIG(treeview)
#if QT_CONFIG(listview)
    } else if (classname == "QListView"_L1) {
        iface = new QAccessibleList(widget);
#endif
#if QT_CONFIG(itemviews)
    } else if (classname == "QTableView"_L1) {
        iface = new QAccessibleTable(widget);
#endif // QT_CONFIG(itemviews)
#if QT_CONFIG(tabbar)
    } else if (classname == "QTabBar"_L1) {
        iface = new QAccessibleTabBar(widget);
#endif
    } else if (classname == "QSizeGrip"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#if QT_CONFIG(splitter)
    } else if (classname == "QSplitter"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Splitter);
    } else if (classname == "QSplitterHandle"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Grip);
#endif
#if QT_CONFIG(textedit) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextEdit"_L1) {
        iface = new QAccessibleTextEdit(widget);
    } else if (classname == "QPlainTextEdit"_L1) {
        iface = new QAccessiblePlainTextEdit(widget);
#endif
    } else if (classname == "QTipLabel"_L1) {
        iface = new QAccessibleDisplay(widget, QAccessible::ToolTip);
    } else if (classname == "QFrame"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#if QT_CONFIG(stackedwidget)
    } else if (classname == "QStackedWidget"_L1) {
        iface = new QAccessibleStackedWidget(widget);
#endif
#if QT_CONFIG(toolbox)
    } else if (classname == "QToolBox"_L1) {
        iface = new QAccessibleToolBox(widget);
#endif
#if QT_CONFIG(mdiarea)
    } else if (classname == "QMdiArea"_L1) {
        iface = new QAccessibleMdiArea(widget);
    } else if (classname == "QMdiSubWindow"_L1) {
        iface = new QAccessibleMdiSubWindow(widget);
#endif
#if QT_CONFIG(dialogbuttonbox)
    } else if (classname == "QDialogButtonBox"_L1) {
        iface = new QAccessibleDialogButtonBox(widget);
#endif
#if QT_CONFIG(dial)
    } else if (classname == "QDial"_L1) {
        iface = new QAccessibleDial(widget);
#endif
#if QT_CONFIG(rubberband)
    } else if (classname == "QRubberBand"_L1) {
        iface = new QAccessibleWidget(widget, QAccessible::Border);
#endif
#if QT_CONFIG(textbrowser) && !defined(QT_NO_CURSOR)
    } else if (classname == "QTextBrowser"_L1) {
        iface = new QAccessibleTextBrowser(widget);
#endif
#if QT_CONFIG(scrollarea)
    } else if (classname == "QAbstractScrollArea"_L1) {
        iface = new QAccessibleAbstractScrollArea(widget);
    } else if (classname == "QScrollArea"_L1) {
        iface = new QAccessibleScrollArea(widget);
#endif
#if QT_CONFIG(calendarwidget)
    } else if (classname == "QCalendarWidget"_L1) {
        iface = new QAccessibleCalendarWidget(widget);
#endif
#if QT_CONFIG(dockwidget)
    } else if (classname == "QDockWidget"_L1) {
        iface = new QAccessibleDockWidget(widget);
#endif

    } else if (classname == "QWidget"_L1) {
        iface = new QAccessibleWidget(widget);
    } else if (classname == "QWindowContainer"_L1) {
        iface = new QAccessibleWindowContainer(widget);
    }

    return iface;
}